

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILPSolver.cpp
# Opt level: O0

void __thiscall CILPSolver::PrepareCoeffBuffer(CILPSolver *this,int iNumCoeff,int iNumVariable)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  double *pdVar4;
  int *piVar5;
  int local_24;
  int local_20;
  int i_1;
  int iIndex;
  int i;
  int iNumVariable_local;
  int iNumCoeff_local;
  CILPSolver *this_local;
  
  if (iNumCoeff == 0) {
    __assert_fail("iNumCoeff",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/ILPSolver.cpp"
                  ,0x1ed,"void CILPSolver::PrepareCoeffBuffer(int, int)");
  }
  if (this->m_iNumCoeff < iNumCoeff) {
    if (this->m_pCoeff != (double *)0x0) {
      if (this->m_pCoeff != (double *)0x0) {
        operator_delete__(this->m_pCoeff);
      }
      this->m_pCoeff = (double *)0x0;
    }
    if (this->m_pCoeffIndex != (int *)0x0) {
      if (this->m_pCoeffIndex != (int *)0x0) {
        operator_delete__(this->m_pCoeffIndex);
      }
      this->m_pCoeffIndex = (int *)0x0;
    }
    this->m_iNumCoeff = iNumCoeff;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)(this->m_iNumCoeff + 1);
    uVar3 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pdVar4 = (double *)operator_new__(uVar3);
    this->m_pCoeff = pdVar4;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)(this->m_iNumCoeff + 1);
    uVar3 = SUB168(auVar2 * ZEXT816(4),0);
    if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    piVar5 = (int *)operator_new__(uVar3);
    this->m_pCoeffIndex = piVar5;
    if (this->m_pCoeff == (double *)0x0) {
      __assert_fail("m_pCoeff",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/ILPSolver.cpp"
                    ,0x1f8,"void CILPSolver::PrepareCoeffBuffer(int, int)");
    }
    if (this->m_pCoeffIndex == (int *)0x0) {
      __assert_fail("m_pCoeffIndex",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/ILPSolver.cpp"
                    ,0x1f9,"void CILPSolver::PrepareCoeffBuffer(int, int)");
    }
  }
  if (iNumVariable != 0) {
    for (i_1 = 0; i_1 < iNumCoeff + 1; i_1 = i_1 + 1) {
      this->m_pCoeff[i_1] = 1.0;
    }
    local_20 = 1;
    for (local_24 = (iNumVariable - iNumCoeff) + 2; local_24 <= iNumVariable;
        local_24 = local_24 + 1) {
      this->m_pCoeffIndex[local_20] = local_24;
      local_20 = local_20 + 1;
    }
  }
  return;
}

Assistant:

void CILPSolver::PrepareCoeffBuffer(int iNumCoeff, int iNumVariable)
{
	assert(iNumCoeff);

	if(iNumCoeff>m_iNumCoeff)
	{
		SAFE_DELA(m_pCoeff);
		SAFE_DELA(m_pCoeffIndex);

		m_iNumCoeff		=	iNumCoeff;
		m_pCoeff		=	new	double[m_iNumCoeff+1];
		m_pCoeffIndex	=	new	int[m_iNumCoeff+1];

		assert(m_pCoeff);
		assert(m_pCoeffIndex);
	}

	if(iNumVariable)
	{
		for(int i=0;i<iNumCoeff+1;++i)	m_pCoeff[i]	=	1;
		for(int iIndex=1,i=iNumVariable-iNumCoeff+2;i<=iNumVariable;++i)	m_pCoeffIndex[iIndex++]	=	i;		
	}

#ifdef _DEBUG
	m_pCoeffIndex[0]			=	-99;
	m_pCoeffIndex[m_iNumCoeff]	=	-99;
	m_pCoeff[0]					=	-99;
	m_pCoeff[m_iNumCoeff]		=	-99;
#endif
}